

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

basic_string<char,_eastl::allocator> * __thiscall
eastl::basic_string<char,_eastl::allocator>::append
          (basic_string<char,_eastl::allocator> *this,value_type *pBegin,value_type *pEnd)

{
  uint *puVar1;
  value_type *pDestination;
  char *pcVar2;
  value_type *pTemp;
  pointer pNewEnd;
  pointer pNewBegin;
  size_type local_30;
  uint local_2c;
  size_type nLength;
  size_type nCapacity;
  size_type n;
  size_type nOldSize;
  value_type *pEnd_local;
  value_type *pBegin_local;
  basic_string<char,_eastl::allocator> *this_local;
  
  if (pBegin != pEnd) {
    nCapacity = (int)this->mpEnd - (int)this->mpBegin;
    nLength = (int)pEnd - (int)pBegin;
    local_2c = ((int)this->mpCapacity - (int)this->mpBegin) - 1;
    _n = pEnd;
    pEnd_local = pBegin;
    pBegin_local = (value_type *)this;
    if (local_2c < nCapacity + nLength) {
      pNewBegin._4_4_ = GetNewCapacity(this,local_2c);
      pNewBegin._0_4_ = nCapacity + nLength;
      puVar1 = max_alt<unsigned_int>((uint *)((long)&pNewBegin + 4),(uint *)&pNewBegin);
      local_30 = *puVar1 + 1;
      pDestination = DoAllocate(this,local_30);
      pcVar2 = CharStringUninitializedCopy<char>(this->mpBegin,this->mpEnd,pDestination);
      pcVar2 = CharStringUninitializedCopy<char>(pEnd_local,_n,pcVar2);
      *pcVar2 = '\0';
      DeallocateSelf(this);
      this->mpBegin = pDestination;
      this->mpEnd = pcVar2;
      this->mpCapacity = pDestination + local_30;
    }
    else {
      CharStringUninitializedCopy<char>(pBegin + 1,pEnd,this->mpEnd + 1);
      this->mpEnd[nLength] = '\0';
      *this->mpEnd = *pEnd_local;
      this->mpEnd = this->mpEnd + nLength;
    }
  }
  return this;
}

Assistant:

basic_string<T, Allocator>& basic_string<T, Allocator>::append(const value_type* pBegin, const value_type* pEnd)
    {
        if(pBegin != pEnd)
        {
            const size_type nOldSize = (size_type)(mpEnd - mpBegin);
            const size_type n        = (size_type)(pEnd - pBegin);

            #if EASTL_STRING_OPT_LENGTH_ERRORS
                if(EASTL_UNLIKELY(((size_t)n > kMaxSize) || (nOldSize > (kMaxSize - n))))
                    ThrowLengthException();
            #endif

            const size_type nCapacity = (size_type)((mpCapacity - mpBegin) - 1);

            if((nOldSize + n) > nCapacity)
            {
                const size_type nLength = eastl::max_alt((size_type)GetNewCapacity(nCapacity), (size_type)(nOldSize + n)) + 1; // + 1 to accomodate the trailing 0.

                pointer pNewBegin = DoAllocate(nLength);
                pointer pNewEnd   = pNewBegin;

                pNewEnd = CharStringUninitializedCopy(mpBegin, mpEnd, pNewBegin);
                pNewEnd = CharStringUninitializedCopy(pBegin,  pEnd,  pNewEnd);
               *pNewEnd = 0;

                DeallocateSelf();
                mpBegin    = pNewBegin;
                mpEnd      = pNewEnd;
                mpCapacity = pNewBegin + nLength; 
            }
            else
            {
                const value_type* pTemp = pBegin;
                ++pTemp;
                CharStringUninitializedCopy(pTemp, pEnd, mpEnd + 1);
                mpEnd[n] = 0;
               *mpEnd    = *pBegin;
                mpEnd   += n;
            }
        }

        return *this; 
    }